

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall ocl::OpenCLEngine::trackEvent(OpenCLEngine *this,cl_event ev,string *message)

{
  pointer pcVar1;
  cl_int cVar2;
  ocl_exception *this_00;
  long *plVar3;
  size_type *psVar4;
  cl_int result;
  int local_134;
  cl_event local_130 [5];
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_134 = 0;
  local_130[0] = ev;
  cVar2 = clFlush(this->command_queue_);
  pcVar1 = (message->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + message->_M_string_length);
  reportError(cVar2,0x16d,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  cVar2 = clWaitForEvents(1,local_130);
  pcVar1 = (message->_M_dataplus)._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + message->_M_string_length);
  reportError(cVar2,0x16e,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  cVar2 = clGetEventInfo(local_130[0],0x11d3,4,&local_134,(size_t *)0x0);
  pcVar1 = (message->_M_dataplus)._M_p;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + message->_M_string_length);
  reportError(cVar2,0x16f,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_134 == 0) {
    cVar2 = clReleaseEvent(local_130[0]);
    pcVar1 = (message->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + message->_M_string_length);
    reportError(cVar2,0x179,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (ocl_exception *)__cxa_allocate_exception(0x10);
  to_string<int>(&local_68,local_134);
  std::operator+(&local_48,
                 "Wait for event succeed, but it is still is not complete with execution status: ",
                 &local_68);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_108._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_108._M_dataplus._M_p == psVar4) {
    local_108.field_2._M_allocated_capacity = *psVar4;
    local_108.field_2._8_8_ = plVar3[3];
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar4;
  }
  local_108._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  ocl_exception::ocl_exception(this_00,&local_108);
  __cxa_throw(this_00,&ocl_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OpenCLEngine::trackEvent(cl_event ev, std::string message)
{
	cl_int		ciErrNum	= CL_SUCCESS;
	cl_int		result		= CL_SUCCESS;

	try {
		OCL_SAFE_CALL_MESSAGE(clFlush(queue()), message);
		OCL_SAFE_CALL_MESSAGE(clWaitForEvents(1, &ev), message);
		OCL_SAFE_CALL_MESSAGE(clGetEventInfo(ev, CL_EVENT_COMMAND_EXECUTION_STATUS, sizeof(cl_int), &result, 0), message);

		if (result != CL_COMPLETE) {
			throw ocl_exception("Wait for event succeed, but it is still is not complete with execution status: " + to_string(result) + "!");
		}
	} catch (...) {
		OCL_SAFE_CALL_MESSAGE(clReleaseEvent(ev), message);
		throw;
	}

	OCL_SAFE_CALL_MESSAGE(clReleaseEvent(ev), message);
}